

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

int francis_iter(double *A,int N,double *H)

{
  bool bVar1;
  double *A_00;
  double *temp;
  int u;
  int t;
  int q;
  int p;
  int it;
  int j;
  int i;
  int brkpoint;
  int success;
  double *H_local;
  int N_local;
  double *A_local;
  
  q = 0;
  t = N + -1;
  A_00 = (double *)malloc((long)N * 8 * (long)N);
  for (it = 0; it < N * N; it = it + 1) {
    H[it] = A[it];
  }
  hessenberg(H,N);
  while (1 < t && q < N * 0x1e) {
    while( true ) {
      bVar1 = false;
      if (1 < t) {
        bVar1 = true;
        if ((H[N * t + t + -1] != 0.0) || (NAN(H[N * t + t + -1]))) {
          bVar1 = H[N * (t + -1) + t + -2] == 0.0;
        }
      }
      if (!bVar1) break;
      if ((H[N * t + t + -1] != 0.0) || (NAN(H[N * t + t + -1]))) {
        if ((H[N * (t + -1) + t + -2] == 0.0) && (!NAN(H[N * (t + -1) + t + -2]))) {
          t = t + -2;
        }
      }
      else {
        t = t + -1;
      }
    }
    u = t;
    if (0 < t) {
      do {
        u = u + -1;
        bVar1 = false;
        if (0 < u) {
          bVar1 = ABS(H[N * u + u + -1]) != 0.0;
        }
      } while (bVar1);
      for (it = u; it <= t; it = it + 1) {
        for (p = u; p <= t; p = p + 1) {
          A_00[((it - u) * ((t - u) + 1) + p) - u] = H[it * N + p];
        }
      }
      francisQR(A_00,(t - u) + 1);
      for (it = u; it <= t; it = it + 1) {
        for (p = u; p <= t; p = p + 1) {
          H[it * N + p] = A_00[((it - u) * ((t - u) + 1) + p) - u];
        }
      }
      for (it = u; it <= t + -1; it = it + 1) {
        if ((double)((ulong)H[(it + 1) * N + it] & (ulong)DAT_00177110) <=
            (ABS(H[it * N + it]) + ABS(H[(it + 1) * N + it + 1])) * 1e-12) {
          H[(it + 1) * N + it] = 0.0;
        }
      }
      q = q + 1;
    }
  }
  i = (int)(q != N * 0x1e);
  free(A_00);
  return i;
}

Assistant:

int francis_iter(double *A, int N, double *H) {
	int success,brkpoint;
	int i,j,it,p,q,t,u;
	double *temp;
	success = 0;
	brkpoint = 30 * N;
	it = 0;
	p = N - 1;
	temp = (double*) malloc(sizeof(double) * N * N);
	for(i = 0; i < N*N;++i) {
		H[i] = A[i];
	}
	
	hessenberg(H,N);
	
	while (p > 1 && it < brkpoint) {
		
		while (p > 1 && (H[N*p + p-1] == 0 || H[N*(p-1) + p-2] == 0)) {
			if (H[N*p + p-1] == 0) {
				p--;
			} else if (H[N*(p-1) + p-2] == 0) {
				p=p-2;
			}
		}
		
		if (p > 0) {
			q = p-1;
			while (q > 0 && fabs(H[N*q + q-1]) != 0) {
				q--;
			}
			//printf("%d %d \n",q,p);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					temp[u+j-q] = H[t+j];
				}
			}
			francisQR(temp,p-q+1);
			for (i=q; i <= p; i++) {
				t = i * N;
				u = (i-q) * (p-q+1);
				for (j=q; j <= p; j++) {
					H[t+j] = temp[u+j-q];
				}
			}
			//mdisplay(H,N,N);
			for(i = q; i <= p-1;++i) {
				if ( fabs(H[(i+1)*N+i]) <= TOL * (fabs(H[i*N+i]) + fabs(H[(i+1)*N+i+1]) ) ) {
					H[(i+1)*N+i] = 0.;
				}
			}
			it++;
			//printf("iter %d \n",it);
		}
	}
	
	if (it == brkpoint) {
		success = 0;
	} else {
		success = 1;
	}
	
	free(temp);
	return success;
}